

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaQNameRefPtr
xmlSchemaCheckAttrGroupCircularRecur
          (xmlSchemaAttributeGroupPtr_conflict ctxtGr,xmlSchemaItemListPtr list)

{
  xmlSchemaAttributeGroupPtr_conflict pxVar1;
  xmlSchemaQNameRefPtr pxVar2;
  int local_3c;
  int i;
  xmlSchemaQNameRefPtr circ;
  xmlSchemaQNameRefPtr ref;
  xmlSchemaAttributeGroupPtr_conflict gr;
  xmlSchemaItemListPtr list_local;
  xmlSchemaAttributeGroupPtr_conflict ctxtGr_local;
  
  local_3c = 0;
  do {
    if (list->nbItems <= local_3c) {
      return (xmlSchemaQNameRefPtr)0x0;
    }
    pxVar2 = (xmlSchemaQNameRefPtr)list->items[local_3c];
    if (((pxVar2->type == XML_SCHEMA_EXTRA_QNAMEREF) &&
        (pxVar2->itemType == XML_SCHEMA_TYPE_ATTRIBUTEGROUP)) &&
       (pxVar2->item != (xmlSchemaBasicItemPtr)0x0)) {
      pxVar1 = (xmlSchemaAttributeGroupPtr_conflict)pxVar2->item;
      if (pxVar1 == ctxtGr) {
        return pxVar2;
      }
      if ((((pxVar1->flags & 4U) == 0) && (pxVar1->attrUses != (void *)0x0)) &&
         ((pxVar1->flags & 0x10U) != 0)) {
        pxVar1->flags = pxVar1->flags | 4;
        pxVar2 = xmlSchemaCheckAttrGroupCircularRecur(ctxtGr,(xmlSchemaItemListPtr)pxVar1->attrUses)
        ;
        pxVar1->flags = pxVar1->flags ^ 4;
        if (pxVar2 != (xmlSchemaQNameRefPtr)0x0) {
          return pxVar2;
        }
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

static xmlSchemaQNameRefPtr
xmlSchemaCheckAttrGroupCircularRecur(xmlSchemaAttributeGroupPtr ctxtGr,
				     xmlSchemaItemListPtr list)
{
    xmlSchemaAttributeGroupPtr gr;
    xmlSchemaQNameRefPtr ref, circ;
    int i;
    /*
    * We will search for an attribute group reference which
    * references the context attribute group.
    */
    for (i = 0; i < list->nbItems; i++) {
	ref = list->items[i];
	if ((ref->type == XML_SCHEMA_EXTRA_QNAMEREF) &&
	    (ref->itemType == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) &&
	    (ref->item != NULL))
	{
	    gr = WXS_ATTR_GROUP_CAST ref->item;
	    if (gr == ctxtGr)
		return(ref);
	    if (gr->flags & XML_SCHEMAS_ATTRGROUP_MARKED)
		continue;
	    /*
	    * Mark as visited to avoid infinite recursion on
	    * circular references not yet examined.
	    */
	    if ((gr->attrUses) &&
		(gr->flags & XML_SCHEMAS_ATTRGROUP_HAS_REFS))
	    {
		gr->flags |= XML_SCHEMAS_ATTRGROUP_MARKED;
		circ = xmlSchemaCheckAttrGroupCircularRecur(ctxtGr,
		    (xmlSchemaItemListPtr) gr->attrUses);
		gr->flags ^= XML_SCHEMAS_ATTRGROUP_MARKED;
		if (circ != NULL)
		    return (circ);
	    }

	}
    }
    return (NULL);
}